

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.c
# Opt level: O1

Token * read_operator(Lexer *lexer,CharBuff *buff)

{
  Kind kind;
  uint uVar1;
  ulong uVar2;
  char *kind_00;
  Token *pTVar3;
  char c;
  KindMeta KVar4;
  
  kind = read_chr(lexer);
  uVar1 = read_chr(lexer);
  c = (char)kind;
  if (uVar1 < 0x3f) {
    uVar2 = (ulong)uVar1;
    if ((0x6000684000000000U >> (uVar2 & 0x3f) & 1) == 0) {
      if (uVar2 == 0x2a) {
        read_multi_note(lexer,buff);
      }
      else {
        if (uVar2 != 0x2f) goto LAB_0010280e;
        read_single_note(lexer,buff);
      }
      append_chr(buff,c);
      kind_00 = to_string(buff);
      kind = EMPTY;
      goto LAB_0010285d;
    }
  }
  else {
LAB_0010280e:
    if (uVar1 != 0x7c) {
      lexer->last_chr = uVar1;
      append_chr(buff,c);
      kind_00 = to_string(buff);
      goto LAB_0010285d;
    }
  }
  append_chr(buff,c);
  append_chr(buff,(char)uVar1);
  kind_00 = to_string(buff);
  KVar4 = find_kind(kind_00);
  kind = KVar4.kind;
LAB_0010285d:
  pTVar3 = new_token(lexer,kind,kind_00);
  return pTVar3;
}

Assistant:

Token *read_operator(Lexer* lexer, CharBuff* buff){
    int chr = read_chr(lexer);
    int op = read_chr(lexer);
    /**
     * ++  -- ....
     */
    switch (op) {
        case '.':
        case '+':
        case '-':
        case '&':
        case '|':
        case '>':
        case '=': {
            append_chr(buff, (char) chr);
            append_chr(buff, (char) op);
            char *s = to_string(buff);
            KindMeta kind = find_kind(s);
            return new_token(lexer, kind.kind, s);
        }
        case '/':
        case '*': {
            if (op == '/') {
                // single
                read_single_note(lexer, buff);
            } else {
                // multi
                read_multi_note(lexer,  buff);
            }
            break;
        }
        default: {
            unread_chr(lexer, op);
            append_chr(buff, (char )chr);
            return new_token(lexer, chr, to_string(buff));
        }
    }
    append_chr(buff, (char)chr);
    return new_token(lexer, EMPTY, to_string(buff));
}